

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigWin.c
# Opt level: O2

void Aig_ManFindCut(Aig_Obj_t *pRoot,Vec_Ptr_t *vFront,Vec_Ptr_t *vVisited,int nSizeLimit,
                   int nFanoutLimit)

{
  byte *pbVar1;
  ulong *puVar2;
  Aig_Obj_t *pAVar3;
  int iVar4;
  void *pvVar5;
  ulong uVar6;
  
  if (((ulong)pRoot & 1) != 0) {
    __assert_fail("!Aig_IsComplement(pRoot)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigWin.c"
                  ,0x96,"void Aig_ManFindCut(Aig_Obj_t *, Vec_Ptr_t *, Vec_Ptr_t *, int, int)");
  }
  if ((*(uint *)&pRoot->field_0x18 & 7) - 7 < 0xfffffffe) {
    __assert_fail("Aig_ObjIsNode(pRoot)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigWin.c"
                  ,0x97,"void Aig_ManFindCut(Aig_Obj_t *, Vec_Ptr_t *, Vec_Ptr_t *, int, int)");
  }
  pAVar3 = pRoot->pFanin0;
  if (pAVar3 == (Aig_Obj_t *)0x0) {
    __assert_fail("Aig_ObjChild0(pRoot)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigWin.c"
                  ,0x98,"void Aig_ManFindCut(Aig_Obj_t *, Vec_Ptr_t *, Vec_Ptr_t *, int, int)");
  }
  if (pRoot->pFanin1 == (Aig_Obj_t *)0x0) {
    __assert_fail("Aig_ObjChild1(pRoot)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigWin.c"
                  ,0x99,"void Aig_ManFindCut(Aig_Obj_t *, Vec_Ptr_t *, Vec_Ptr_t *, int, int)");
  }
  vFront->nSize = 0;
  Vec_PtrPush(vFront,(void *)((ulong)pAVar3 & 0xfffffffffffffffe));
  Vec_PtrPush(vFront,(void *)((ulong)pRoot->pFanin1 & 0xfffffffffffffffe));
  vVisited->nSize = 0;
  Vec_PtrPush(vVisited,pRoot);
  Vec_PtrPush(vVisited,(void *)((ulong)pRoot->pFanin0 & 0xfffffffffffffffe));
  Vec_PtrPush(vVisited,(void *)((ulong)pRoot->pFanin1 & 0xfffffffffffffffe));
  if ((*(ulong *)&pRoot->field_0x18 & 0x10) != 0) {
    __assert_fail("!pRoot->fMarkA",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigWin.c"
                  ,0xa7,"void Aig_ManFindCut(Aig_Obj_t *, Vec_Ptr_t *, Vec_Ptr_t *, int, int)");
  }
  uVar6 = (ulong)pRoot->pFanin0 & 0xfffffffffffffffe;
  if ((*(byte *)(uVar6 + 0x18) & 0x10) != 0) {
    __assert_fail("!Aig_ObjFanin0(pRoot)->fMarkA",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigWin.c"
                  ,0xa8,"void Aig_ManFindCut(Aig_Obj_t *, Vec_Ptr_t *, Vec_Ptr_t *, int, int)");
  }
  if ((*(byte *)(((ulong)pRoot->pFanin1 & 0xfffffffffffffffe) + 0x18) & 0x10) != 0) {
    __assert_fail("!Aig_ObjFanin1(pRoot)->fMarkA",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigWin.c"
                  ,0xa9,"void Aig_ManFindCut(Aig_Obj_t *, Vec_Ptr_t *, Vec_Ptr_t *, int, int)");
  }
  *(ulong *)&pRoot->field_0x18 = *(ulong *)&pRoot->field_0x18 | 0x10;
  pbVar1 = (byte *)(uVar6 + 0x18);
  *pbVar1 = *pbVar1 | 0x10;
  puVar2 = (ulong *)(((ulong)pRoot->pFanin1 & 0xfffffffffffffffe) + 0x18);
  *puVar2 = *puVar2 | 0x10;
  do {
    iVar4 = Aig_ManFindCut_int(vFront,vVisited,nSizeLimit,nFanoutLimit);
  } while (iVar4 != 0);
  if (vFront->nSize <= nSizeLimit) {
    for (iVar4 = 0; iVar4 < vVisited->nSize; iVar4 = iVar4 + 1) {
      pvVar5 = Vec_PtrEntry(vVisited,iVar4);
      *(byte *)((long)pvVar5 + 0x18) = *(byte *)((long)pvVar5 + 0x18) & 0xef;
    }
    return;
  }
  __assert_fail("Vec_PtrSize(vFront) <= nSizeLimit",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigWin.c"
                ,0xb0,"void Aig_ManFindCut(Aig_Obj_t *, Vec_Ptr_t *, Vec_Ptr_t *, int, int)");
}

Assistant:

void Aig_ManFindCut( Aig_Obj_t * pRoot, Vec_Ptr_t * vFront, Vec_Ptr_t * vVisited, int nSizeLimit, int nFanoutLimit )
{
    Aig_Obj_t * pNode;
    int i;

    assert( !Aig_IsComplement(pRoot) );
    assert( Aig_ObjIsNode(pRoot) );
    assert( Aig_ObjChild0(pRoot) );
    assert( Aig_ObjChild1(pRoot) );

    // start the cut 
    Vec_PtrClear( vFront );
    Vec_PtrPush( vFront, Aig_ObjFanin0(pRoot) );
    Vec_PtrPush( vFront, Aig_ObjFanin1(pRoot) );

    // start the visited nodes
    Vec_PtrClear( vVisited );
    Vec_PtrPush( vVisited, pRoot );
    Vec_PtrPush( vVisited, Aig_ObjFanin0(pRoot) );
    Vec_PtrPush( vVisited, Aig_ObjFanin1(pRoot) );

    // mark these nodes
    assert( !pRoot->fMarkA );
    assert( !Aig_ObjFanin0(pRoot)->fMarkA );
    assert( !Aig_ObjFanin1(pRoot)->fMarkA );
    pRoot->fMarkA = 1;
    Aig_ObjFanin0(pRoot)->fMarkA = 1;
    Aig_ObjFanin1(pRoot)->fMarkA = 1;

    // compute the cut
    while ( Aig_ManFindCut_int( vFront, vVisited, nSizeLimit, nFanoutLimit ) );
    assert( Vec_PtrSize(vFront) <= nSizeLimit );

    // clean the visit markings
    Vec_PtrForEachEntry( Aig_Obj_t *, vVisited, pNode, i )
        pNode->fMarkA = 0;
}